

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O0

int __thiscall Fl_Tabs::handle(Fl_Tabs *this,int event)

{
  Fl_When FVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Fl_Tabs *pFVar7;
  Fl_Widget *pFVar8;
  char *t;
  char sc;
  Fl_Widget *c;
  Fl_Tabs *pFStack_60;
  int H_1;
  Fl_Widget *n;
  Fl_Widget *o_1;
  int ret;
  Fl_Widget_Tracker local_38;
  Fl_Widget_Tracker wp;
  int H;
  int i;
  Fl_Widget *o;
  int event_local;
  Fl_Tabs *this_local;
  
  switch(event) {
  case 1:
    wp.wp_._0_4_ = tab_height(this);
    if ((int)wp.wp_ < 0) {
      iVar6 = Fl::event_y();
      iVar4 = Fl_Widget::y((Fl_Widget *)this);
      iVar2 = Fl_Widget::h((Fl_Widget *)this);
      if (iVar6 < iVar4 + iVar2 + (int)wp.wp_) {
        iVar6 = Fl_Group::handle(&this->super_Fl_Group,event);
        return iVar6;
      }
    }
    else {
      iVar6 = Fl::event_y();
      iVar4 = Fl_Widget::y((Fl_Widget *)this);
      if (iVar4 + (int)wp.wp_ < iVar6) {
        iVar6 = Fl_Group::handle(&this->super_Fl_Group,event);
        return iVar6;
      }
    }
  case 2:
  case 5:
    iVar6 = Fl::event_x();
    iVar4 = Fl::event_y();
    pFVar8 = which(this,iVar6,iVar4);
    if (event == 2) {
      push(this,(Fl_Widget *)0x0);
      if (((pFVar8 != (Fl_Widget *)0x0) && (iVar6 = Fl::visible_focus(), iVar6 != 0)) &&
         (pFVar7 = (Fl_Tabs *)Fl::focus(), pFVar7 != this)) {
        Fl::focus((Fl_Widget *)this);
        redraw_tabs(this);
      }
      if ((pFVar8 != (Fl_Widget *)0x0) &&
         ((iVar6 = value(this,pFVar8), iVar6 != 0 ||
          (FVar1 = Fl_Widget::when((Fl_Widget *)this),
          (FVar1 & FL_WHEN_NOT_CHANGED) != FL_WHEN_NEVER)))) {
        Fl_Widget_Tracker::Fl_Widget_Tracker(&local_38,pFVar8);
        Fl_Widget::set_changed((Fl_Widget *)this);
        Fl_Widget::do_callback((Fl_Widget *)this);
        iVar6 = Fl_Widget_Tracker::deleted(&local_38);
        if (iVar6 != 0) {
          this_local._4_4_ = 1;
        }
        Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_38);
        if (iVar6 != 0) {
          return this_local._4_4_;
        }
      }
      Fl_Tooltip::current(pFVar8);
    }
    else {
      push(this,pFVar8);
    }
    this_local._4_4_ = 1;
    break;
  case 6:
  case 7:
    iVar6 = Fl::visible_focus();
    if (iVar6 == 0) {
      this_local._4_4_ = Fl_Group::handle(&this->super_Fl_Group,event);
    }
    else {
      iVar6 = Fl::event();
      if ((((iVar6 == 2) || (iVar6 = Fl::event(), iVar6 == 0xc)) ||
          (iVar6 = Fl::event(), iVar6 == 8)) ||
         ((iVar6 = Fl::event(), iVar6 == 6 || (iVar6 = Fl::event(), iVar6 == 7)))) {
        redraw_tabs(this);
        iVar6 = Fl::event();
        if (iVar6 == 6) {
          this_local._4_4_ = Fl_Group::handle(&this->super_Fl_Group,event);
        }
        else {
          iVar6 = Fl::event();
          if (iVar6 == 7) {
            this_local._4_4_ = 0;
          }
          else {
            this_local._4_4_ = 1;
          }
        }
      }
      else {
        this_local._4_4_ = Fl_Group::handle(&this->super_Fl_Group,event);
      }
    }
    break;
  case 8:
    iVar6 = Fl::event_key();
    if (iVar6 == 0xff51) {
      iVar6 = Fl_Group::children(&this->super_Fl_Group);
      if (iVar6 == 0) {
        this_local._4_4_ = 0;
      }
      else {
        pFVar8 = Fl_Group::child(&this->super_Fl_Group,0);
        uVar5 = Fl_Widget::visible(pFVar8);
        if (uVar5 == 0) {
          for (wp.wp_._4_4_ = 1; iVar6 = wp.wp_._4_4_,
              iVar4 = Fl_Group::children(&this->super_Fl_Group), iVar6 < iVar4;
              wp.wp_._4_4_ = wp.wp_._4_4_ + 1) {
            pFVar8 = Fl_Group::child(&this->super_Fl_Group,wp.wp_._4_4_);
            uVar5 = Fl_Widget::visible(pFVar8);
            if (uVar5 != 0) break;
          }
          pFVar8 = Fl_Group::child(&this->super_Fl_Group,wp.wp_._4_4_ + -1);
          value(this,pFVar8);
          Fl_Widget::set_changed((Fl_Widget *)this);
          Fl_Widget::do_callback((Fl_Widget *)this);
          this_local._4_4_ = 1;
        }
        else {
          this_local._4_4_ = 0;
        }
      }
    }
    else if (iVar6 == 0xff53) {
      iVar6 = Fl_Group::children(&this->super_Fl_Group);
      if (iVar6 == 0) {
        this_local._4_4_ = 0;
      }
      else {
        iVar6 = Fl_Group::children(&this->super_Fl_Group);
        pFVar8 = Fl_Group::child(&this->super_Fl_Group,iVar6 + -1);
        uVar5 = Fl_Widget::visible(pFVar8);
        if (uVar5 == 0) {
          for (wp.wp_._4_4_ = 0; iVar6 = wp.wp_._4_4_,
              iVar4 = Fl_Group::children(&this->super_Fl_Group), iVar6 < iVar4;
              wp.wp_._4_4_ = wp.wp_._4_4_ + 1) {
            pFVar8 = Fl_Group::child(&this->super_Fl_Group,wp.wp_._4_4_);
            uVar5 = Fl_Widget::visible(pFVar8);
            if (uVar5 != 0) break;
          }
          pFVar8 = Fl_Group::child(&this->super_Fl_Group,wp.wp_._4_4_ + 1);
          value(this,pFVar8);
          Fl_Widget::set_changed((Fl_Widget *)this);
          Fl_Widget::do_callback((Fl_Widget *)this);
          this_local._4_4_ = 1;
        }
        else {
          this_local._4_4_ = 0;
        }
      }
    }
    else if (iVar6 == 0xff54) {
      Fl_Widget::redraw((Fl_Widget *)this);
      this_local._4_4_ = Fl_Group::handle(&this->super_Fl_Group,6);
    }
    else {
      this_local._4_4_ = Fl_Group::handle(&this->super_Fl_Group,event);
    }
    break;
  case 0xb:
    this_local._4_4_ = Fl_Group::handle(&this->super_Fl_Group,event);
    pFVar7 = (Fl_Tabs *)Fl_Tooltip::current();
    iVar6 = tab_height(this);
    if (-1 < iVar6) {
      iVar4 = Fl::event_y();
      iVar2 = Fl_Widget::y((Fl_Widget *)this);
      if (iVar2 + iVar6 < iVar4) {
        return this_local._4_4_;
      }
    }
    if (iVar6 < 0) {
      iVar4 = Fl::event_y();
      iVar2 = Fl_Widget::y((Fl_Widget *)this);
      iVar3 = Fl_Widget::h((Fl_Widget *)this);
      if (iVar4 < iVar2 + iVar3 + iVar6) {
        return this_local._4_4_;
      }
    }
    iVar6 = Fl::event_x();
    iVar4 = Fl::event_y();
    pFStack_60 = (Fl_Tabs *)which(this,iVar6,iVar4);
    if (pFStack_60 == (Fl_Tabs *)0x0) {
      pFStack_60 = this;
    }
    if (pFStack_60 != pFVar7) {
      (*Fl_Tooltip::enter)((Fl_Widget *)pFStack_60);
    }
    break;
  case 0xc:
    for (wp.wp_._4_4_ = 0; iVar6 = wp.wp_._4_4_, iVar4 = Fl_Group::children(&this->super_Fl_Group),
        iVar6 < iVar4; wp.wp_._4_4_ = wp.wp_._4_4_ + 1) {
      pFVar8 = Fl_Group::child(&this->super_Fl_Group,wp.wp_._4_4_);
      t = Fl_Widget::label(pFVar8);
      iVar6 = Fl_Widget::test_shortcut(t,false);
      if (iVar6 != 0) {
        uVar5 = Fl_Widget::visible(pFVar8);
        value(this,pFVar8);
        if (uVar5 == 0) {
          Fl_Widget::set_changed((Fl_Widget *)this);
        }
        Fl_Widget::do_callback((Fl_Widget *)this);
        return 1;
      }
    }
    this_local._4_4_ = Fl_Group::handle(&this->super_Fl_Group,event);
    break;
  case 0x10:
    value(this);
  default:
    iVar6 = Fl_Group::handle(&this->super_Fl_Group,event);
    return iVar6;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Tabs::handle(int event) {

  Fl_Widget *o;
  int i;

  switch (event) {

  case FL_PUSH: {
    int H = tab_height();
    if (H >= 0) {
      if (Fl::event_y() > y()+H) return Fl_Group::handle(event);
    } else {
      if (Fl::event_y() < y()+h()+H) return Fl_Group::handle(event);
    }}
    /* FALLTHROUGH */
  case FL_DRAG:
  case FL_RELEASE:
    o = which(Fl::event_x(), Fl::event_y());
    if (event == FL_RELEASE) {
      push(0);
      if (o && Fl::visible_focus() && Fl::focus()!=this) {
        Fl::focus(this);
        redraw_tabs();
      }
      if (o &&                              // Released on a tab and..
          (value(o) ||                      // tab changed value or..
	   (when()&(FL_WHEN_NOT_CHANGED))   // ..no change but WHEN_NOT_CHANGED set,
	  )                                 // handles FL_WHEN_RELEASE_ALWAYS too.
	 ) {
        Fl_Widget_Tracker wp(o);
        set_changed();
	do_callback();
	if (wp.deleted()) return 1;
      }
      Fl_Tooltip::current(o);
    } else {
      push(o);
    }
    return 1;
  case FL_MOVE: {
    int ret = Fl_Group::handle(event);
    Fl_Widget *o = Fl_Tooltip::current(), *n = o;
    int H = tab_height();
    if ( (H>=0) && (Fl::event_y()>y()+H) )
      return ret;
    else if ( (H<0) && (Fl::event_y() < y()+h()+H) )
      return ret;
    else {
      n = which(Fl::event_x(), Fl::event_y());
      if (!n) n = this;
    }
    if (n!=o)
      Fl_Tooltip::enter(n);
    return ret; }
  case FL_FOCUS:
  case FL_UNFOCUS:
    if (!Fl::visible_focus()) return Fl_Group::handle(event);
    if (Fl::event() == FL_RELEASE ||
	Fl::event() == FL_SHORTCUT ||
	Fl::event() == FL_KEYBOARD ||
	Fl::event() == FL_FOCUS ||
	Fl::event() == FL_UNFOCUS) {
      redraw_tabs();
      if (Fl::event() == FL_FOCUS) return Fl_Group::handle(event);
      if (Fl::event() == FL_UNFOCUS) return 0;
      else return 1;
    } else return Fl_Group::handle(event);
  case FL_KEYBOARD:
    switch (Fl::event_key()) {
      case FL_Left:
	if (!children()) return 0;
	if (child(0)->visible()) return 0;
	for (i = 1; i < children(); i ++)
	  if (child(i)->visible()) break;
	value(child(i - 1));
	set_changed();
	do_callback();
        return 1;
      case FL_Right:
	if (!children()) return 0;
	if (child(children() - 1)->visible()) return 0;
	for (i = 0; i < children(); i ++)
	  if (child(i)->visible()) break;
	value(child(i + 1));
	set_changed();
	do_callback();
        return 1;
      case FL_Down:
        redraw();
        return Fl_Group::handle(FL_FOCUS);
      default:
        break;
    }
    return Fl_Group::handle(event);
  case FL_SHORTCUT:
    for (i = 0; i < children(); ++i) {
      Fl_Widget *c = child(i);
      if (c->test_shortcut(c->label())) {
        char sc = !c->visible();
        value(c);
        if (sc) set_changed();
        do_callback();
        return 1;
      }
    }
    return Fl_Group::handle(event);
  case FL_SHOW:
    value(); // update visibilities and fall through
  default:
    return Fl_Group::handle(event);

  }
}